

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bstrcpy(const_bstring b)

{
  int iVar1;
  uchar *puVar2;
  int local_28;
  int j;
  int i;
  bstring b0;
  const_bstring b_local;
  
  if (((b == (const_bstring)0x0) || (b->slen < 0)) || (b->data == (uchar *)0x0)) {
    b_local = (const_bstring)0x0;
  }
  else {
    b_local = (const_bstring)malloc(0x10);
    if (b_local == (const_bstring)0x0) {
      b_local = (const_bstring)0x0;
    }
    else {
      iVar1 = b->slen;
      local_28 = snapUpSize(iVar1 + 1);
      puVar2 = (uchar *)malloc((long)local_28);
      b_local->data = puVar2;
      if (b_local->data == (uchar *)0x0) {
        local_28 = iVar1 + 1;
        puVar2 = (uchar *)malloc((long)local_28);
        b_local->data = puVar2;
        if (b_local->data == (uchar *)0x0) {
          free(b_local);
          return (bstring)0x0;
        }
      }
      b_local->mlen = local_28;
      b_local->slen = iVar1;
      if (iVar1 != 0) {
        memcpy(b_local->data,b->data,(long)iVar1);
      }
      b_local->data[b_local->slen] = '\0';
    }
  }
  return b_local;
}

Assistant:

bstring bstrcpy (const_bstring b) {
bstring b0;
int i,j;

	/* Attempted to copy an invalid string? */
	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;

	b0 = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b0 == NULL) {
		/* Unable to allocate memory for string header */
		return NULL;
	}

	i = b->slen;
	j = snapUpSize (i + 1);

	b0->data = (unsigned char *) bstr__alloc (j);
	if (b0->data == NULL) {
		j = i + 1;
		b0->data = (unsigned char *) bstr__alloc (j);
		if (b0->data == NULL) {
			/* Unable to allocate memory for string data */
			bstr__free (b0);
			return NULL;
		}
	}

	b0->mlen = j;
	b0->slen = i;

	if (i) bstr__memcpy ((char *) b0->data, (char *) b->data, i);
	b0->data[b0->slen] = (unsigned char) '\0';

	return b0;
}